

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

Iterator * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::Iterator::operator++(Iterator *this)

{
  int iVar1;
  size_t sVar2;
  Iterator *in_RDI;
  Iterator *this_00;
  
  if (-1 < in_RDI->m_index) {
    in_RDI->m_index = in_RDI->m_index + 1;
    iVar1 = in_RDI->m_index;
    this_00 = in_RDI;
    sVar2 = VectorDynSize::size(&in_RDI->m_matrix->m_values);
    if ((ulong)(long)iVar1 < sVar2) {
      updateTriplet(this_00);
    }
    else {
      in_RDI->m_index = -1;
    }
  }
  return in_RDI;
}

Assistant:

typename SparseMatrix<ordering>::Iterator& SparseMatrix<ordering>::Iterator::operator++()
    {
        if (m_index < 0) {
            //Iterator is not valid. We do nothing
            return *this;
        }
        m_index++;
        if (static_cast<std::size_t>(m_index) >= m_matrix.m_values.size()) {
            //Out of range
            m_index = -1;
        } else {
            updateTriplet();
        }

        return *this;
    }